

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void cm_zlib__tr_stored_block(deflate_state *s,charf *buf,ulg stored_len,int last)

{
  ulg uVar1;
  byte bVar2;
  int val;
  int len;
  int last_local;
  ulg stored_len_local;
  charf *buf_local;
  deflate_state *s_local;
  
  if (s->bi_valid < 0xe) {
    s->bi_buf = s->bi_buf | (ushort)((last & 0xffffU) << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 3;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)((last & 0xffffU) << ((byte)s->bi_valid & 0x1f));
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)((int)(last & 0xffffU) >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -0xd;
  }
  bi_windup(s);
  uVar1 = s->pending;
  s->pending = uVar1 + 1;
  s->pending_buf[uVar1] = (byte)stored_len;
  bVar2 = (byte)(stored_len >> 8);
  uVar1 = s->pending;
  s->pending = uVar1 + 1;
  s->pending_buf[uVar1] = bVar2;
  uVar1 = s->pending;
  s->pending = uVar1 + 1;
  s->pending_buf[uVar1] = (byte)stored_len ^ 0xff;
  uVar1 = s->pending;
  s->pending = uVar1 + 1;
  s->pending_buf[uVar1] = bVar2 ^ 0xff;
  if (stored_len != 0) {
    memcpy(s->pending_buf + s->pending,buf,stored_len);
  }
  s->pending = stored_len + s->pending;
  return;
}

Assistant:

void ZLIB_INTERNAL _tr_stored_block(deflate_state *s, charf *buf,
                                    ulg stored_len, int last) {
    send_bits(s, (STORED_BLOCK<<1) + last, 3);  /* send block type */
    bi_windup(s);        /* align on byte boundary */
    put_short(s, (ush)stored_len);
    put_short(s, (ush)~stored_len);
    if (stored_len)
        zmemcpy(s->pending_buf + s->pending, (Bytef *)buf, stored_len);
    s->pending += stored_len;
#ifdef ZLIB_DEBUG
    s->compressed_len = (s->compressed_len + 3 + 7) & (ulg)~7L;
    s->compressed_len += (stored_len + 4) << 3;
    s->bits_sent += 2*16;
    s->bits_sent += stored_len << 3;
#endif
}